

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_klass.hpp
# Opt level: O1

Klass<Foo2,_Foo> * __thiscall
squall::Klass<Foo2,Foo>::func<void(Foo2::*)()>
          (Klass<Foo2,Foo> *this,string *name,offset_in_Foo2_to_subr f)

{
  int iVar1;
  HSQUIRRELVM vm;
  int iVar2;
  undefined8 in_RCX;
  SQObjectValue extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long *plVar3;
  bool bVar4;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  HSQOBJECT local_40;
  
  vm = (HSQUIRRELVM)**(undefined8 **)this;
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0x10);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar2 = this_00->_M_use_count;
    do {
      if (iVar2 == 0) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar1 = this_00->_M_use_count;
      bVar4 = iVar2 == iVar1;
      if (bVar4) {
        this_00->_M_use_count = iVar2 + 1;
        iVar1 = iVar2;
      }
      iVar2 = iVar1;
      UNLOCK();
    } while (!bVar4);
  }
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar4 = true;
  }
  else {
    bVar4 = this_00->_M_use_count == 0;
  }
  if (bVar4) {
    plVar3 = (long *)0x0;
  }
  else {
    plVar3 = *(long **)(this + 8);
  }
  local_40._type = (**(code **)(*plVar3 + 0x18))();
  local_58 = (code *)0x0;
  pcStack_50 = (code *)0x0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  if (f != 0) {
    pcStack_50 = std::_Function_handler<void_(Foo2_*),_void_(Foo2::*)()>::_M_invoke;
    local_58 = std::_Function_handler<void_(Foo2_*),_void_(Foo2::*)()>::_M_manager;
    local_68._M_unused._M_member_pointer = f;
    local_68._8_8_ = in_RCX;
  }
  local_40._unVal = extraout_RDX;
  detail::defun_local<void,Foo2*>(vm,&local_40,name,(function<void_(Foo2_*)> *)&local_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return (Klass<Foo2,_Foo> *)this;
}

Assistant:

Klass<C, Base>& func(const string& name, F f) {
        detail::defun_local(
            vm_.handle(),
            imp_.lock()->get_klass_object(),
            name,
            to_function(f));
        return *this;
    }